

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

Maybe<unsigned_long> __thiscall kj::StringPtr::findLast(StringPtr *this,char c)

{
  char *pcVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  undefined7 in_register_00000031;
  size_t sVar2;
  Maybe<unsigned_long> MVar4;
  Maybe<unsigned_long> MVar5;
  size_t sVar3;
  
  sVar3 = ((long *)CONCAT71(in_register_00000031,c))[1] - 1;
  do {
    sVar2 = sVar3 - 1;
    if (sVar3 == 0) {
      *(undefined1 *)&(this->content).ptr = 0;
      MVar5.ptr.field_1.value = in_RDX.value;
      MVar5.ptr._0_8_ = this;
      return (Maybe<unsigned_long>)MVar5.ptr;
    }
    pcVar1 = (char *)(*(long *)CONCAT71(in_register_00000031,c) + -1 + sVar3);
    sVar3 = sVar2;
  } while (*pcVar1 != (char)in_RDX.value);
  *(undefined1 *)&(this->content).ptr = 1;
  (this->content).size_ = sVar2;
  MVar4.ptr.field_1.value = in_RDX.value;
  MVar4.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar4.ptr;
}

Assistant:

inline Maybe<size_t> StringPtr::findLast(char c) const {
  for (size_t i = size(); i > 0; --i) {
    if (content[i-1] == c) {
      return i-1;
    }
  }
  return nullptr;
}